

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab_session.cpp
# Opt level: O0

void __thiscall cab_session::handle_update(cab_session *this)

{
  cab *this_00;
  bool bVar1;
  id_type iVar2;
  message_size mVar3;
  ostream *poVar4;
  value_type *pvVar5;
  reference pvVar6;
  vector<node_type,_std::allocator<node_type>_> local_90;
  value_type local_72;
  value_type local_71;
  iterator iStack_70;
  uchar e;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range3;
  vector<node_type,_std::allocator<node_type>_> converted;
  undefined1 local_29 [8];
  backend_route_update_message route_message;
  backend_position_update_message position_message;
  cab_session *this_local;
  
  unique0x1000045f = this;
  backend_route_update_message::backend_route_update_message
            ((backend_route_update_message *)local_29);
  bVar1 = basic_message<backend_position_update_message,_(message_id)194>::readable
                    ((basic_message<backend_position_update_message,_(message_id)194> *)
                     &route_message.route.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,&this->_buffer);
  if (bVar1) {
    basic_message<backend_position_update_message,_(message_id)194>::from_buffer
              ((basic_message<backend_position_update_message,_(message_id)194> *)
               &route_message.route.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&this->_buffer);
    poVar4 = std::operator<<((ostream *)&std::cout,"Cab with id ");
    iVar2 = cab::id(this->_cab);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    poVar4 = std::operator<<(poVar4," moved to ");
    poVar4 = ::operator<<(poVar4,(node_type)
                                 route_message.route.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator<<(poVar4,'\n');
    cab::update_position
              (this->_cab,
               (node_type)
               route_message.route.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    bVar1 = basic_message<backend_route_update_message,_(message_id)195>::readable
                      ((basic_message<backend_route_update_message,_(message_id)195> *)local_29,
                       &this->_buffer);
    if (bVar1) {
      basic_message<backend_route_update_message,_(message_id)195>::from_buffer
                ((basic_message<backend_route_update_message,_(message_id)195> *)local_29,
                 &this->_buffer);
      poVar4 = std::operator<<((ostream *)&std::cout,"Cab with id ");
      iVar2 = cab::id(this->_cab);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
      std::operator<<(poVar4," updated its route\n");
      std::vector<node_type,_std::allocator<node_type>_>::vector
                ((vector<node_type,_std::allocator<node_type>_> *)&__range3);
      mVar3 = basic_message<backend_route_update_message,_(message_id)195>::size
                        ((basic_message<backend_route_update_message,_(message_id)195> *)local_29);
      std::vector<node_type,_std::allocator<node_type>_>::reserve
                ((vector<node_type,_std::allocator<node_type>_> *)&__range3,(ulong)mVar3);
      std::operator<<((ostream *)&std::cout,"received route: ");
      __end3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_29);
      iStack_70 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_29);
      while (bVar1 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffff90), bVar1) {
        pvVar5 = __gnu_cxx::
                 __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator*(&__end3);
        local_72 = *pvVar5;
        local_71 = local_72;
        std::vector<node_type,_std::allocator<node_type>_>::push_back
                  ((vector<node_type,_std::allocator<node_type>_> *)&__range3,&local_72);
        pvVar6 = std::vector<node_type,_std::allocator<node_type>_>::back
                           ((vector<node_type,_std::allocator<node_type>_> *)&__range3);
        poVar4 = ::operator<<((ostream *)&std::cout,*pvVar6);
        std::operator<<(poVar4,", ");
        __gnu_cxx::
        __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator++(&__end3);
      }
      std::operator<<((ostream *)&std::cout,'\n');
      this_00 = this->_cab;
      std::vector<node_type,_std::allocator<node_type>_>::vector
                (&local_90,(vector<node_type,_std::allocator<node_type>_> *)&__range3);
      cab::update_route(this_00,&local_90);
      std::vector<node_type,_std::allocator<node_type>_>::~vector(&local_90);
      std::vector<node_type,_std::allocator<node_type>_>::~vector
                ((vector<node_type,_std::allocator<node_type>_> *)&__range3);
    }
  }
  handle_receive(this);
  backend_route_update_message::~backend_route_update_message
            ((backend_route_update_message *)local_29);
  return;
}

Assistant:

void cab_session::handle_update()
{
    backend_position_update_message position_message;
    backend_route_update_message route_message;
    if(position_message.readable(_buffer))
    {
        position_message.from_buffer(_buffer);

        std::cout << "Cab with id " << _cab->id() << " moved to " << static_cast<node_type>(position_message.position) << '\n';

        _cab->update_position(static_cast<node_type>(position_message.position));
    }
    else if(route_message.readable(_buffer))
    {
        route_message.from_buffer(_buffer);

        std::cout << "Cab with id " << _cab->id() << " updated its route\n";

        std::vector<node_type> converted;
        converted.reserve(route_message.size());
        std::cout << "received route: ";
        for(auto e : route_message.route)
        {
            converted.push_back(static_cast<node_type>(e));
            std::cout << converted.back() << ", ";
        }
        std::cout << '\n';
        _cab->update_route(converted);
    }

    handle_receive();
}